

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_low_impl.h
# Opt level: O0

int secp256k1_scalar_shr_int(secp256k1_scalar *r,int n)

{
  uint uVar1;
  int in_ESI;
  uint *in_RDI;
  int ret;
  
  if (in_ESI < 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/scalar_low_impl.h"
            ,0x67,"test condition failed: n > 0");
    abort();
  }
  if (0xf < in_ESI) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/scalar_low_impl.h"
            ,0x68,"test condition failed: n < 16");
    abort();
  }
  uVar1 = *in_RDI;
  *in_RDI = *in_RDI >> ((byte)in_ESI & 0x1f);
  return uVar1 & (1 << ((byte)in_ESI & 0x1f)) - 1U;
}

Assistant:

static int secp256k1_scalar_shr_int(secp256k1_scalar *r, int n) {
    int ret;
    VERIFY_CHECK(n > 0);
    VERIFY_CHECK(n < 16);
    ret = *r & ((1 << n) - 1);
    *r >>= n;
    return ret;
}